

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yyText(GREG *G,int begin,int end)

{
  int iVar1;
  char *pcVar2;
  uint uVar3;
  
  uVar3 = end - begin;
  if (uVar3 == 0 || end < begin) {
    uVar3 = 0;
  }
  else {
    while (G->textlen <= (int)uVar3) {
      iVar1 = G->textlen * 2;
      G->textlen = iVar1;
      pcVar2 = (char *)realloc(G->text,(long)iVar1);
      G->text = pcVar2;
    }
    memcpy(G->text,G->buf + begin,(ulong)uVar3);
  }
  G->text[uVar3] = '\0';
  return uVar3;
}

Assistant:

YY_LOCAL(int) yyText(GREG *G, int begin, int end)
{
  int yyleng= end - begin;
  if (yyleng <= 0)
    yyleng= 0;
  else
    {
      while (G->textlen < (yyleng + 1))
        {
          G->textlen *= 2;
          G->text= (char*)YY_REALLOC(G->text, G->textlen, G->data);
        }
      memcpy(G->text, G->buf + begin, yyleng);
    }
  G->text[yyleng]= '\0';
  return yyleng;
}